

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O3

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  byte *pbVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  char *first;
  byte *pbVar6;
  ulong uVar7;
  char *tok_buf;
  char value [256];
  char content [1024];
  byte *local_560;
  ulong local_558;
  ulong local_550;
  char *local_548;
  char *local_540;
  char local_538 [256];
  char local_438 [1032];
  
  local_540 = digest->nonce;
  local_560 = (byte *)chlg;
  Curl_auth_digest_cleanup(digest);
  local_550 = 0;
  local_558 = 0;
  pbVar1 = local_560;
  do {
    local_560 = pbVar1;
    bVar2 = *chlg;
    while ((bVar2 != 0 && (iVar4 = Curl_isspace((uint)bVar2), iVar4 != 0))) {
      bVar2 = ((byte *)chlg)[1];
      chlg = (char *)((byte *)chlg + 1);
    }
    local_560 = (byte *)chlg;
    _Var3 = Curl_auth_digest_get_pair(chlg,local_538,local_438,(char **)&local_560);
    if (!_Var3) {
      if ((local_540 != (char *)0x0) && (digest->stale != true)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce != (char *)0x0) {
        return CURLE_OK;
      }
      return CURLE_BAD_CONTENT_ENCODING;
    }
    iVar4 = Curl_strcasecompare(local_538,"nonce");
    if (iVar4 != 0) {
      (*Curl_cfree)(digest->nonce);
      pcVar5 = (*Curl_cstrdup)(local_438);
      digest->nonce = pcVar5;
      goto joined_r0x00421dcf;
    }
    iVar4 = Curl_strcasecompare(local_538,"stale");
    if (iVar4 != 0) {
      iVar4 = Curl_strcasecompare(local_438,"true");
      uVar7 = local_550;
      if (iVar4 != 0) {
        digest->stale = true;
        digest->nc = 1;
      }
      goto LAB_00421b9f;
    }
    iVar4 = Curl_strcasecompare(local_538,"realm");
    if (iVar4 == 0) {
      iVar4 = Curl_strcasecompare(local_538,"opaque");
      if (iVar4 != 0) {
        (*Curl_cfree)(digest->opaque);
        pcVar5 = (*Curl_cstrdup)(local_438);
        digest->opaque = pcVar5;
        goto joined_r0x00421dcf;
      }
      iVar4 = Curl_strcasecompare(local_538,"qop");
      if (iVar4 != 0) {
        local_548 = (char *)0x0;
        pcVar5 = (*Curl_cstrdup)(local_438);
        uVar7 = local_550;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        first = strtok_r(pcVar5,",",&local_548);
        while (first != (char *)0x0) {
          iVar4 = Curl_strcasecompare(first,"auth");
          if (iVar4 == 0) {
            iVar4 = Curl_strcasecompare(first,"auth-int");
            local_558 = CONCAT71((int7)(local_558 >> 8),(byte)local_558 | iVar4 != 0);
          }
          else {
            uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
          }
          first = strtok_r((char *)0x0,",",&local_548);
        }
        (*Curl_cfree)(pcVar5);
        if ((uVar7 & 1) == 0) {
          if ((local_558 & 1) == 0) goto LAB_00421b9f;
          (*Curl_cfree)(digest->qop);
          pcVar5 = "auth-int";
        }
        else {
          (*Curl_cfree)(digest->qop);
          pcVar5 = "auth";
        }
        pcVar5 = (*Curl_cstrdup)(pcVar5);
        digest->qop = pcVar5;
        local_550 = uVar7;
        goto joined_r0x00421dcf;
      }
      iVar4 = Curl_strcasecompare(local_538,"algorithm");
      if (iVar4 == 0) {
        iVar4 = Curl_strcasecompare(local_538,"userhash");
        uVar7 = local_550;
        if ((iVar4 != 0) &&
           (iVar4 = Curl_strcasecompare(local_438,"true"), uVar7 = local_550, iVar4 != 0)) {
          digest->userhash = true;
        }
      }
      else {
        (*Curl_cfree)(digest->algorithm);
        pcVar5 = (*Curl_cstrdup)(local_438);
        digest->algorithm = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar4 = Curl_strcasecompare(local_438,"MD5-sess");
        if (iVar4 == 0) {
          iVar4 = Curl_strcasecompare(local_438,"MD5");
          if (iVar4 == 0) {
            iVar4 = Curl_strcasecompare(local_438,"SHA-256");
            if (iVar4 == 0) {
              iVar4 = Curl_strcasecompare(local_438,"SHA-256-SESS");
              if (iVar4 == 0) {
                iVar4 = Curl_strcasecompare(local_438,"SHA-512-256");
                if (iVar4 == 0) {
                  iVar4 = Curl_strcasecompare(local_438,"SHA-512-256-SESS");
                  if (iVar4 == 0) {
                    return CURLE_BAD_CONTENT_ENCODING;
                  }
                  digest->algo = 5;
                  uVar7 = local_550;
                }
                else {
                  digest->algo = 4;
                  uVar7 = local_550;
                }
              }
              else {
                digest->algo = 3;
                uVar7 = local_550;
              }
            }
            else {
              digest->algo = 2;
              uVar7 = local_550;
            }
          }
          else {
            digest->algo = 0;
            uVar7 = local_550;
          }
        }
        else {
          digest->algo = 1;
          uVar7 = local_550;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->realm);
      pcVar5 = (*Curl_cstrdup)(local_438);
      digest->realm = pcVar5;
joined_r0x00421dcf:
      uVar7 = local_550;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_00421b9f:
    local_550 = uVar7;
    bVar2 = *local_560;
    chlg = (char *)local_560;
    while (pbVar1 = (byte *)chlg, bVar2 != 0) {
      pbVar6 = (byte *)chlg + 1;
      iVar4 = Curl_isspace((uint)bVar2);
      if (iVar4 == 0) {
        if (*chlg == 0x2c) {
          chlg = (char *)pbVar6;
          pbVar1 = pbVar6;
        }
        break;
      }
      chlg = (char *)pbVar6;
      bVar2 = *pbVar6;
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        char *tok_buf = NULL;
        /* Tokenize the list and choose auth if possible, use a temporary
           clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else if(strcasecompare(content, "SHA-256"))
          digest->algo = CURLDIGESTALGO_SHA256;
        else if(strcasecompare(content, "SHA-256-SESS"))
          digest->algo = CURLDIGESTALGO_SHA256SESS;
        else if(strcasecompare(content, "SHA-512-256"))
          digest->algo = CURLDIGESTALGO_SHA512_256;
        else if(strcasecompare(content, "SHA-512-256-SESS"))
          digest->algo = CURLDIGESTALGO_SHA512_256SESS;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else if(strcasecompare(value, "userhash")) {
        if(strcasecompare(content, "true")) {
          digest->userhash = TRUE;
        }
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}